

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall Parser::is_array(Parser *this)

{
  bool bVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  Tokenizer::get_current_token_abi_cxx11_(&local_58,this->tokenizer);
  bVar1 = std::operator!=(&local_58,"[");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"]",&local_59);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[",&local_5a);
    check_expected_x_after_y(this,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return !bVar1;
}

Assistant:

bool Parser::is_array() {
    // only to be called once we know Tokenizer::type() == "IDENTIFIER"
    if (tokenizer.get_current_token() != "[") {
        return false;
    }
    query_tokenizer();

    check_expected_x_after_y("]", "[");
    return true;
}